

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

bool __thiscall MemoryManager::copyMemory(MemoryManager *this,void *src,uint32_t dest,uint32_t len)

{
  uint addr;
  ulong uVar1;
  
  uVar1 = 0;
  while( true ) {
    if (len == uVar1) {
      return true;
    }
    addr = (uint)(dest + uVar1);
    if ((this->memory[dest + uVar1 >> 0x16 & 0x3ff] == (uint8_t **)0x0) ||
       (this->memory[dest + uVar1 >> 0x16 & 0x3ff][addr >> 0xc & 0x3ff] == (uint8_t *)0x0)) break;
    setByte(this,addr,*(uint8_t *)((long)src + uVar1),(uint32_t *)0x0);
    uVar1 = uVar1 + 1;
  }
  fprintf(_stderr,"Data Copy Unsuccessfully, invalid addr 0x%x!\n",(ulong)(dest + (int)uVar1));
  exit(-1);
}

Assistant:

bool MemoryManager::copyMemory(void *src, uint32_t dest, uint32_t len) {
    for (uint32_t i = 0; i < len; i++) {
        if (!this->addrExist(dest + i)) {
            fprintf(stderr, "Data Copy Unsuccessfully, invalid addr 0x%x!\n", dest + i);
            exit(-1);
        }
        this->setByte(dest + i, ((uint8_t *) src)[i]);
    }
    return true;
}